

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

bool move_prog_stone_roll(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  string_view fmt;
  bool bVar1;
  ROOM_INDEX_DATA *pRVar2;
  long in_RDI;
  __type_conflict2 _Var3;
  bool found;
  OBJ_DATA *corpse;
  OBJ_DATA *obj;
  EXIT_DATA *exit;
  ROOM_INDEX_DATA *room2;
  OBJ_DATA *in_stack_ffffffffffffff98;
  OBJ_DATA *obj_00;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  CLogger *this;
  size_t in_stack_ffffffffffffffc8;
  EXIT_DATA *pEVar4;
  
  pRVar2 = get_room_index(in_stack_ffffffffffffffac);
  pEVar4 = pRVar2->exit[1];
  bVar1 = false;
  obj_00 = (OBJ_DATA *)pEVar4->exit_info[0];
  _Var3 = std::pow<int,int>(0,0x6be1b1);
  if (((ulong)obj_00 & (long)_Var3) == 0) {
    _Var3 = std::pow<int,int>(0,0x6be1dd);
    pEVar4->exit_info[0] = (long)_Var3 | pEVar4->exit_info[0];
    _Var3 = std::pow<int,int>(0,0x6be1fb);
    pEVar4->exit_info[0] = (long)_Var3 | pEVar4->exit_info[0];
    _Var3 = std::pow<int,int>(0,0x6be21c);
    pEVar4->exit_info[0] = (long)_Var3 | pEVar4->exit_info[0];
    act((char *)in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),obj_00,
        in_stack_ffffffffffffff98,0);
    for (this = *(CLogger **)(in_RDI + 0x20); this != (CLogger *)0x0; this = *(CLogger **)this) {
      if (*(short *)(*(long *)(this + 0x50) + 0x50) == 0x5fee) {
        bVar1 = true;
        break;
      }
    }
    if (bVar1) {
      if (*(long *)(this + 0x10) == 0) {
        get_obj_index(in_stack_ffffffffffffffac);
        create_object((OBJ_INDEX_DATA *)ch,dir);
        obj_to_obj(obj_00,in_stack_ffffffffffffff98);
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      fmt._M_str = (char *)pEVar4;
      fmt._M_len = in_stack_ffffffffffffffc8;
      CLogger::Warn<>(this,fmt);
    }
  }
  return true;
}

Assistant:

bool move_prog_stone_roll(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	ROOM_INDEX_DATA *room2 = get_room_index(24559);
	EXIT_DATA *exit = room2->exit[Directions::East];
	OBJ_DATA *obj, *corpse;
	bool found= false;

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return true;

	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);
	SET_BIT(exit->exit_info, EX_NONOBVIOUS);

	act("As you pass through, the stone rolls violently back into place!", ch, 0, 0, TO_CHAR);

	for (corpse = room->contents; corpse != nullptr; corpse = corpse->next)
	{
		if (corpse->pIndexData->vnum == 24558)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		RS.Logger.Warn("Corpse in 24560 missing.  Odd.");
		return true;
	}

	if (corpse->contains)
		return true;

	obj = create_object(get_obj_index(24560), 10);
	obj_to_obj(obj, corpse);
	return true;
}